

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ethread.c
# Opt level: O2

void av1_compute_num_workers_for_mt(AV1_COMP *cpi)

{
  int iVar1;
  int i;
  long lVar2;
  
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 1) {
    if ((cpi->oxcf).pass < AOM_RC_LAST_PASS) {
      iVar1 = compute_num_enc_workers(cpi,(cpi->oxcf).max_threads);
    }
    else {
      iVar1 = 0;
    }
    (cpi->ppi->p_mt_info).num_mod_workers[lVar2] = iVar1;
  }
  return;
}

Assistant:

void av1_compute_num_workers_for_mt(AV1_COMP *cpi) {
  for (int i = MOD_FP; i < NUM_MT_MODULES; i++) {
    cpi->ppi->p_mt_info.num_mod_workers[i] =
        compute_num_mod_workers(cpi, (MULTI_THREADED_MODULES)i);
  }
}